

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void parsePrecedence(Precedence precedence)

{
  _Bool _Var1;
  ParseFn p_Var2;
  
  advance();
  p_Var2 = rules[parser.previous.type].prefix;
  if (p_Var2 == (ParseFn)0x0) {
    error("Expect expression.");
    return;
  }
  while( true ) {
    (*p_Var2)(precedence < PREC_OR);
    if (rules[parser.current.type].precedence < precedence) break;
    advance();
    p_Var2 = rules[parser.previous.type].infix;
  }
  if (precedence < PREC_OR) {
    _Var1 = match(TOKEN_EQUAL);
    if (_Var1) {
      error("Invalid assignment target.");
      expression();
      return;
    }
  }
  return;
}

Assistant:

static void parsePrecedence(Precedence precedence) {
    advance();
    ParseFn prefixRule = getRule(parser.previous.type)->prefix;
    if (prefixRule == NULL) {
        error("Expect expression.");
        return;
    }

    bool canAssign = precedence <= PREC_ASSIGNMENT;
    prefixRule(canAssign);

    while (precedence <= getRule(parser.current.type)->precedence) {
        advance();
        ParseFn infixRule = getRule(parser.previous.type)->infix;
        infixRule(canAssign);
    }

    if (canAssign && match(TOKEN_EQUAL)) {
        error("Invalid assignment target.");
        expression();
    }
}